

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDIOAnalyzer.cpp
# Opt level: O2

void __thiscall SDIOAnalyzer::~SDIOAnalyzer(SDIOAnalyzer *this)

{
  *(undefined ***)this = &PTR__SDIOAnalyzer_0010bca8;
  Analyzer::KillThread();
  std::unique_ptr<FrameV2,_std::default_delete<FrameV2>_>::~unique_ptr(&this->frameV2);
  SDIOSimulationDataGenerator::~SDIOSimulationDataGenerator(&this->mSimulationDataGenerator);
  std::unique_ptr<SDIOAnalyzerResults,_std::default_delete<SDIOAnalyzerResults>_>::~unique_ptr
            (&this->mResults);
  std::unique_ptr<SDIOAnalyzerSettings,_std::default_delete<SDIOAnalyzerSettings>_>::~unique_ptr
            (&this->mSettings);
  Analyzer::~Analyzer((Analyzer *)this);
  return;
}

Assistant:

SDIOAnalyzer::~SDIOAnalyzer()
{
    KillThread();
}